

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_pkt_generator.c
# Opt level: O2

void rfc5444_writer_flush(rfc5444_writer *writer,rfc5444_writer_target *target,_Bool force)

{
  byte *pbVar1;
  uint __line;
  char cVar2;
  int iVar3;
  uint8_t *puVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  char *__assertion;
  list_entity *plVar9;
  ulong uVar10;
  size_t total;
  
  if (writer->_state == RFC5444_WRITER_NONE) {
    if (target->sendPacket !=
        (_func_void_rfc5444_writer_ptr_rfc5444_writer_target_ptr_void_ptr_size_t *)0x0) {
      if (target->_is_flushed == true) {
        if (!force) {
          return;
        }
        _rfc5444_writer_begin_packet(writer,target);
      }
      writer->_state = RFC5444_WRITER_FINISH_PKTTLV;
      plVar9 = &writer->_pkthandlers;
      while (plVar9 = plVar9->prev, plVar9->next != (writer->_pkthandlers).next) {
        if (plVar9[1].prev != (list_entity *)0x0) {
          (*(code *)plVar9[1].prev)(writer,target);
        }
      }
      writer->_state = RFC5444_WRITER_FINISH_PKTHEADER;
      if (target->finishPacketHeader !=
          (_func_void_rfc5444_writer_ptr_rfc5444_writer_target_ptr *)0x0) {
        (*target->finishPacketHeader)(writer,target);
      }
      puVar4 = (target->_pkt).buffer;
      *puVar4 = '\0';
      if (target->_has_seqno == true) {
        pbVar1 = (target->_pkt).buffer;
        *pbVar1 = *pbVar1 | 8;
        puVar4[1] = *(uint8_t *)((long)&target->_seqno + 1);
        puVar4[2] = (uint8_t)target->_seqno;
        puVar4 = puVar4 + 3;
      }
      else {
        puVar4 = puVar4 + 1;
      }
      sVar8 = (target->_pkt).added;
      sVar7 = (target->_pkt).set;
      lVar6 = sVar7 + sVar8;
      if (lVar6 != 0) {
        pbVar1 = (target->_pkt).buffer;
        *pbVar1 = *pbVar1 | 4;
        *puVar4 = (uint8_t)((ulong)lVar6 >> 8);
        puVar4[1] = (uint8_t)lVar6;
        sVar8 = (target->_pkt).added;
        sVar7 = (target->_pkt).set;
      }
      uVar10 = (ulong)((uint)target->_has_seqno * 2);
      lVar6 = uVar10 + 3;
      if (sVar8 + sVar7 == 0) {
        lVar6 = uVar10 + 1;
      }
      if (target->_bin_msgs_size == 0) {
        sVar5 = 0;
      }
      else {
        puVar4 = (target->_pkt).buffer;
        memmove(puVar4 + lVar6 + sVar8 + sVar7,
                puVar4 + (target->_pkt).allocated + sVar8 + (target->_pkt).header,
                target->_bin_msgs_size);
        sVar8 = (target->_pkt).added;
        sVar7 = (target->_pkt).set;
        sVar5 = target->_bin_msgs_size;
      }
      sVar8 = sVar7 + sVar8 + sVar5 + lVar6;
      plVar9 = &(writer->_processors).list_head;
      do {
        plVar9 = ((list_entity *)&plVar9->next)->next;
        if (plVar9->prev == (writer->_processors).list_head.prev) {
          if (sVar8 != 0) {
            (*target->sendPacket)(writer,target,(target->_pkt).buffer,sVar8);
          }
          break;
        }
        cVar2 = (*(code *)plVar9[4].next)(plVar9,0xffffffff);
      } while ((cVar2 == '\0') || (iVar3 = (*(code *)plVar9[4].prev)(plVar9,target), iVar3 == 0));
      (target->_pkt).set = 0;
      target->_bin_msgs_size = 0;
      target->_is_flushed = true;
      writer->_state = RFC5444_WRITER_NONE;
      return;
    }
    __assertion = "target->sendPacket";
    __line = 0x7a;
  }
  else {
    __assertion = "writer->_state == RFC5444_WRITER_NONE";
    __line = 0x77;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_pkt_generator.c"
                ,__line,
                "void rfc5444_writer_flush(struct rfc5444_writer *, struct rfc5444_writer_target *, _Bool)"
               );
}

Assistant:

void
rfc5444_writer_flush(struct rfc5444_writer *writer, struct rfc5444_writer_target *target, bool force) {
  struct rfc5444_writer_postprocessor *processor;
  struct rfc5444_writer_pkthandler *handler;
  size_t len, total;
  bool error;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  assert(target->sendPacket);

  if (target->_is_flushed) {
    if (!force) {
      return;
    }

    /* begin a new packet, buffer is flushed at the moment */
    _rfc5444_writer_begin_packet(writer, target);
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_FINISH_PKTTLV;
#endif

  /* finalize packet tlvs */
  list_for_each_element_reverse(&writer->_pkthandlers, handler, _pkthandle_node) {
    if (handler->finishPacketTLVs) {
      handler->finishPacketTLVs(writer, target);
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_FINISH_PKTHEADER;
#endif
  /* finalize packet header */
  if (target->finishPacketHeader) {
    target->finishPacketHeader(writer, target);
  }

  /* write packet header (including tlvblock length if necessary */
  _write_pktheader(target);

  /* calculate true length of header (optional tlv block !) */
  len = 1;
  if (target->_has_seqno) {
    len += 2;
  }
  if (target->_pkt.added + target->_pkt.set > 0) {
    len += 2;
  }

  /* compress packet buffer */
  if (target->_bin_msgs_size) {
    memmove(&target->_pkt.buffer[len + target->_pkt.added + target->_pkt.set],
      &target->_pkt.buffer[target->_pkt.header + target->_pkt.added + target->_pkt.allocated], target->_bin_msgs_size);
  }

  /* run post-processors */
  error = false;
  total = len + target->_pkt.added + target->_pkt.set + target->_bin_msgs_size;
  avl_for_each_element(&writer->_processors, processor, _node) {
    if (processor->is_matching_signature(processor, RFC5444_WRITER_PKT_POSTPROCESSOR)) {
      if (processor->process(processor, target, NULL, &target->_pkt.buffer[0], &total)) {
        /* error, stop postprocessing and drop message */
        error = true;
        break;
      }
    }
  }

  if (!error && total > 0) {
    /* send packet */
    target->sendPacket(writer, target, target->_pkt.buffer, total);
  }

  /* cleanup length information */
  target->_pkt.set = 0;
  target->_bin_msgs_size = 0;

  /* mark buffer as flushed */
  target->_is_flushed = true;

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_NONE;
#endif

#if DEBUG_CLEANUP == true
  memset(target->_pkt.buffer, 252, target->_pkt.max);
#endif
}